

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deArrayBuffer.hpp
# Opt level: O0

ArrayBuffer<unsigned_char,_1UL,_1UL> * __thiscall
de::ArrayBuffer<unsigned_char,_1UL,_1UL>::operator=
          (ArrayBuffer<unsigned_char,_1UL,_1UL> *this,ArrayBuffer<unsigned_char,_1UL,_1UL> *other)

{
  undefined1 local_28 [8];
  ArrayBuffer<unsigned_char,_1UL,_1UL> copied;
  ArrayBuffer<unsigned_char,_1UL,_1UL> *other_local;
  ArrayBuffer<unsigned_char,_1UL,_1UL> *this_local;
  
  copied.m_cap = (size_t)other;
  ArrayBuffer((ArrayBuffer<unsigned_char,_1UL,_1UL> *)local_28,other);
  swap(this,(ArrayBuffer<unsigned_char,_1UL,_1UL> *)local_28);
  ~ArrayBuffer((ArrayBuffer<unsigned_char,_1UL,_1UL> *)local_28);
  return this;
}

Assistant:

ArrayBuffer<T,Alignment,Stride>& ArrayBuffer<T,Alignment,Stride>::operator= (const ArrayBuffer& other)
{
	ArrayBuffer copied(other);
	swap(copied);
	return *this;
}